

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

AspifTextOutput * __thiscall Potassco::AspifTextOutput::push(AspifTextOutput *this,AtomSpan *atoms)

{
  uint local_14;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->data_->directives,&local_14);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this->data_,
             (const_iterator)
             (this->data_->directives).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,atoms->first,atoms->first + atoms->size);
  return this;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const AtomSpan& atoms) {
	data_->directives.push_back(static_cast<uint32_t>(size(atoms)));
	data_->directives.insert(data_->directives.end(), begin(atoms), end(atoms));
	return *this;
}